

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O2

void __thiscall jaegertracing::SpanContext::SpanContext(SpanContext *this,SpanContext *ctx)

{
  uint64_t uVar1;
  
  (this->super_SpanContext)._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00297978;
  uVar1 = (ctx->_traceID)._low;
  (this->_traceID)._high = (ctx->_traceID)._high;
  (this->_traceID)._low = uVar1;
  uVar1 = ctx->_parentID;
  this->_spanID = ctx->_spanID;
  this->_parentID = uVar1;
  this->_flags = ctx->_flags;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->_baggage)._M_h,&(ctx->_baggage)._M_h);
  std::__cxx11::string::string((string *)&this->_debugID,(string *)&ctx->_debugID);
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

SpanContext(const SpanContext& ctx)
        : _traceID(ctx._traceID)
        , _spanID(ctx._spanID)
        , _parentID(ctx._parentID)
        , _flags(ctx._flags)
        , _baggage(ctx._baggage)
        , _debugID(ctx._debugID)
    {
    }